

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

bc_string_t * bc_string_append_escaped(bc_string_t *str,char *suffix)

{
  char c;
  bool bVar1;
  bool bVar2;
  
  if (suffix == (char *)0x0 || str == (bc_string_t *)0x0) {
    return str;
  }
  bVar2 = false;
  do {
    c = *suffix;
    if (c == '\\') {
      bVar1 = true;
      if (bVar2) goto LAB_00109a1d;
    }
    else {
      if (c == '\0') {
        return str;
      }
LAB_00109a1d:
      bc_string_append_c(str,c);
      bVar1 = false;
    }
    bVar2 = bVar1;
    suffix = suffix + 1;
  } while( true );
}

Assistant:

bc_string_t*
bc_string_append_escaped(bc_string_t *str, const char *suffix)
{
    if (str == NULL)
        return NULL;
    if (suffix == NULL)
        return str;
    bool escaped = false;
    for (size_t i = 0; suffix[i] != '\0'; i++) {
        if (suffix[i] == '\\' && !escaped) {
            escaped = true;
            continue;
        }
        escaped = false;
        str = bc_string_append_c(str, suffix[i]);
    }
    return str;
}